

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_verify_mlsag
              (secp256k1_context *ctx,uint8_t *preimage,size_t nCols,size_t nRows,uint8_t *pk,
              uint8_t *ki,uint8_t *pc,uint8_t *ps)

{
  long lVar1;
  secp256k1_context *ctx_00;
  long lVar2;
  int iVar3;
  long lVar4;
  secp256k1_fe *rzr;
  size_t len;
  uchar *puVar5;
  secp256k1_sha256 *psVar6;
  undefined8 *puVar7;
  uchar *b32;
  byte bVar8;
  undefined1 auVar9 [16];
  secp256k1_scalar clast;
  secp256k1_scalar ss;
  size_t clen;
  secp256k1_ge ge1;
  secp256k1_gej gej1;
  secp256k1_scalar cSig;
  uint8_t tmp [33];
  secp256k1_gej gej2;
  secp256k1_sha256 sha256_pre;
  secp256k1_gej L;
  secp256k1_gej R;
  secp256k1_fe zr [8];
  secp256k1_ge pre_a [8];
  secp256k1_gej prej [8];
  secp256k1_strauss_point_state ps_1 [1];
  int local_10cc;
  secp256k1_strauss_state local_10c8;
  size_t local_10a8;
  uchar *local_10a0;
  size_t local_1098;
  size_t local_1090;
  secp256k1_context *local_1088;
  uint8_t *local_1080;
  uchar *local_1078;
  secp256k1_scalar local_1070;
  secp256k1_scalar local_1050;
  long local_1030;
  long local_1028;
  uchar *local_1020;
  uchar *local_1018;
  uint8_t *local_1010;
  long local_1008;
  long local_1000;
  uchar *local_ff8;
  long local_ff0;
  size_t local_fe8;
  secp256k1_ge local_fe0;
  secp256k1_gej local_f88;
  undefined1 local_f08 [16];
  undefined1 local_ef8 [16];
  secp256k1_scalar local_ee8;
  uchar local_ec8 [48];
  secp256k1_gej local_e98;
  secp256k1_sha256 local_e18;
  undefined8 local_db0 [13];
  secp256k1_gej local_d48;
  secp256k1_gej local_cc8;
  secp256k1_fe local_c48 [8];
  secp256k1_ge local_b08 [8];
  secp256k1_gej local_848 [8];
  secp256k1_strauss_point_state local_448;
  
  bVar8 = 0;
  local_f08 = (undefined1  [16])0x0;
  local_ef8 = (undefined1  [16])0x0;
  local_10a0 = pk;
  local_1090 = nRows;
  local_1010 = ki;
  secp256k1_scalar_set_b32(&local_1070,pc,&local_10cc);
  iVar3 = 1;
  if ((local_10cc == 0) &&
     ((local_1070.d[3] != 0 || local_1070.d[1] != 0) ||
      (local_1070.d[2] != 0 || local_1070.d[0] != 0))) {
    local_ee8.d[2] = local_1070.d[2];
    local_ee8.d[3] = local_1070.d[3];
    local_ee8.d[0] = local_1070.d[0];
    local_ee8.d[1] = local_1070.d[1];
    local_e18.s[0] = 0x6a09e667;
    local_e18.s[1] = 0xbb67ae85;
    local_e18.s[2] = 0x3c6ef372;
    local_e18.s[3] = 0xa54ff53a;
    local_e18.s[4] = 0x510e527f;
    local_e18.s[5] = 0x9b05688c;
    local_e18.s[6] = 0x1f83d9ab;
    local_e18.s[7] = 0x5be0cd19;
    local_e18.bytes = 0;
    local_1098 = nCols;
    local_1088 = ctx;
    secp256k1_sha256_write(&local_e18,preimage,0x20);
    psVar6 = &local_e18;
    puVar7 = local_db0;
    for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar7 = *(undefined8 *)psVar6->s;
      psVar6 = (secp256k1_sha256 *)((long)psVar6 + (ulong)bVar8 * -0x10 + 8);
      puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
    }
    if (local_1098 != 0) {
      local_1028 = local_1090 - 1;
      local_1030 = local_1028 * local_1098;
      local_1000 = local_1098 * 0x20;
      local_1008 = local_1098 * 0x21;
      local_10a8 = 0;
      puVar5 = local_10a0;
      b32 = ps;
      do {
        puVar7 = local_db0;
        psVar6 = &local_e18;
        for (lVar4 = 0xd; local_1018 = puVar5, local_1020 = b32, local_1080 = local_1010,
            lVar2 = local_1028, lVar1 = local_ff0, lVar4 != 0; lVar4 = lVar4 + -1) {
          *(undefined8 *)psVar6->s = *puVar7;
          puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
          psVar6 = (secp256k1_sha256 *)((long)psVar6 + ((ulong)bVar8 * -2 + 1) * 8);
        }
        while (local_ff0 = lVar2, local_ff0 != 0) {
          secp256k1_scalar_set_b32(&local_1050,b32,&local_10cc);
          if (local_10cc != 0) {
            return 1;
          }
          if ((local_1050.d[3] == 0 && local_1050.d[1] == 0) &&
              (local_1050.d[2] == 0 && local_1050.d[0] == 0)) {
            return 1;
          }
          local_1078 = puVar5;
          local_ff8 = b32;
          iVar3 = secp256k1_eckey_pubkey_parse(&local_fe0,puVar5,0x21);
          ctx_00 = local_1088;
          local_10c8.prej = local_848;
          local_10c8.zr = local_c48;
          local_10c8.pre_a = local_b08;
          local_10c8.ps = &local_448;
          if (iVar3 == 0) {
            return 1;
          }
          local_f88.infinity = local_fe0.infinity;
          local_f88.x.n[4] = local_fe0.x.n[4];
          local_f88.x.n[2] = local_fe0.x.n[2];
          local_f88.x.n[3] = local_fe0.x.n[3];
          local_f88.x.n[0] = local_fe0.x.n[0];
          local_f88.x.n[1] = local_fe0.x.n[1];
          local_f88.y.n[4] = local_fe0.y.n[4];
          local_f88.y.n[2] = local_fe0.y.n[2];
          local_f88.y.n[3] = local_fe0.y.n[3];
          local_f88.y.n[0] = local_fe0.y.n[0];
          local_f88.y.n[1] = local_fe0.y.n[1];
          local_f88.z.n[0] = 1;
          local_f88.z.n[3] = 0;
          local_f88.z.n[4] = 0;
          local_f88.z.n[1] = 0;
          local_f88.z.n[2] = 0;
          secp256k1_ecmult_strauss_wnaf
                    (&local_1088->ecmult_ctx,&local_10c8,&local_d48,1,&local_f88,&local_1070,
                     &local_1050);
          iVar3 = hash_to_curve(&local_fe0,local_1078,len);
          local_10c8.ps = &local_448;
          local_10c8.pre_a = local_b08;
          local_10c8.zr = local_c48;
          local_10c8.prej = local_848;
          if (iVar3 != 0) {
            return 1;
          }
          local_f88.infinity = local_fe0.infinity;
          local_f88.x.n[4] = local_fe0.x.n[4];
          local_f88.x.n[2] = local_fe0.x.n[2];
          local_f88.x.n[3] = local_fe0.x.n[3];
          local_f88.x.n[0] = local_fe0.x.n[0];
          local_f88.x.n[1] = local_fe0.x.n[1];
          local_f88.y.n[4] = local_fe0.y.n[4];
          local_f88.y.n[2] = local_fe0.y.n[2];
          local_f88.y.n[3] = local_fe0.y.n[3];
          local_f88.y.n[0] = local_fe0.y.n[0];
          local_f88.y.n[1] = local_fe0.y.n[1];
          local_f88.z.n[0] = 1;
          local_f88.z.n[3] = 0;
          local_f88.z.n[4] = 0;
          local_f88.z.n[1] = 0;
          local_f88.z.n[2] = 0;
          secp256k1_ecmult_strauss_wnaf
                    (&ctx_00->ecmult_ctx,&local_10c8,&local_f88,1,&local_f88,&local_1050,
                     (secp256k1_scalar *)local_f08);
          iVar3 = secp256k1_eckey_pubkey_parse(&local_fe0,local_1080,0x21);
          local_10c8.ps = &local_448;
          local_10c8.pre_a = local_b08;
          local_10c8.zr = local_c48;
          local_10c8.prej = local_848;
          if (iVar3 == 0) {
            return 1;
          }
          local_e98.infinity = local_fe0.infinity;
          local_e98.x.n[4] = local_fe0.x.n[4];
          local_e98.x.n[2] = local_fe0.x.n[2];
          local_e98.x.n[3] = local_fe0.x.n[3];
          local_e98.x.n[0] = local_fe0.x.n[0];
          local_e98.x.n[1] = local_fe0.x.n[1];
          local_e98.y.n[4] = local_fe0.y.n[4];
          local_e98.y.n[2] = local_fe0.y.n[2];
          local_e98.y.n[3] = local_fe0.y.n[3];
          local_e98.y.n[0] = local_fe0.y.n[0];
          local_e98.y.n[1] = local_fe0.y.n[1];
          local_e98.z.n[0] = 1;
          local_e98.z.n[3] = 0;
          local_e98.z.n[4] = 0;
          local_e98.z.n[1] = 0;
          local_e98.z.n[2] = 0;
          rzr = (secp256k1_fe *)0x1;
          secp256k1_ecmult_strauss_wnaf
                    (&ctx_00->ecmult_ctx,&local_10c8,&local_e98,1,&local_e98,&local_1070,
                     (secp256k1_scalar *)local_f08);
          secp256k1_gej_add_var(&local_cc8,&local_f88,&local_e98,rzr);
          puVar5 = local_1078;
          secp256k1_sha256_write(&local_e18,local_1078,0x21);
          secp256k1_ge_set_gej(&local_fe0,&local_d48);
          secp256k1_eckey_pubkey_serialize(&local_fe0,local_ec8,&local_fe8,1);
          secp256k1_sha256_write(&local_e18,local_ec8,0x21);
          secp256k1_ge_set_gej(&local_fe0,&local_cc8);
          secp256k1_eckey_pubkey_serialize(&local_fe0,local_ec8,&local_fe8,1);
          secp256k1_sha256_write(&local_e18,local_ec8,0x21);
          local_1080 = local_1080 + 0x21;
          b32 = local_ff8 + local_1000;
          puVar5 = puVar5 + local_1008;
          lVar1 = local_ff0;
          lVar2 = local_ff0 + -1;
        }
        local_ff0 = lVar1;
        if (local_1090 != 0) {
          lVar4 = local_1030 + local_10a8;
          secp256k1_scalar_set_b32(&local_1050,ps + lVar4 * 0x20,&local_10cc);
          if (local_10cc != 0) {
            return 1;
          }
          if ((local_1050.d[3] == 0 && local_1050.d[1] == 0) &&
              (local_1050.d[2] == 0 && local_1050.d[0] == 0)) {
            return 1;
          }
          puVar5 = local_10a0 + lVar4 * 0x21;
          iVar3 = secp256k1_eckey_pubkey_parse(&local_fe0,puVar5,0x21);
          local_10c8.pre_a = local_b08;
          local_10c8.ps = &local_448;
          if (iVar3 == 0) {
            return 1;
          }
          local_f88.infinity = local_fe0.infinity;
          local_f88.x.n[4] = local_fe0.x.n[4];
          local_f88.x.n[2] = local_fe0.x.n[2];
          local_f88.x.n[3] = local_fe0.x.n[3];
          local_f88.x.n[0] = local_fe0.x.n[0];
          local_f88.x.n[1] = local_fe0.x.n[1];
          local_f88.y.n[0] = local_fe0.y.n[0];
          local_f88.y.n[1] = local_fe0.y.n[1];
          local_f88.y.n[4] = local_fe0.y.n[4];
          local_f88.y.n[2] = local_fe0.y.n[2];
          local_f88.y.n[3] = local_fe0.y.n[3];
          local_f88.z.n[0] = 1;
          local_f88.z.n[3] = 0;
          local_f88.z.n[4] = 0;
          local_f88.z.n[1] = 0;
          local_f88.z.n[2] = 0;
          local_10c8.prej = local_848;
          local_10c8.zr = local_c48;
          secp256k1_ecmult_strauss_wnaf
                    (&local_1088->ecmult_ctx,&local_10c8,&local_d48,1,&local_f88,&local_1070,
                     &local_1050);
          secp256k1_sha256_write(&local_e18,puVar5,0x21);
          secp256k1_ge_set_gej(&local_fe0,&local_d48);
          secp256k1_eckey_pubkey_serialize(&local_fe0,local_ec8,&local_fe8,1);
          secp256k1_sha256_write(&local_e18,local_ec8,0x21);
        }
        secp256k1_sha256_finalize(&local_e18,local_ec8);
        secp256k1_scalar_set_b32(&local_1070,local_ec8,&local_10cc);
        if (local_10cc != 0) {
          return 1;
        }
        if ((local_1070.d[3] == 0 && local_1070.d[1] == 0) &&
            (local_1070.d[2] == 0 && local_1070.d[0] == 0)) {
          return 1;
        }
        local_10a8 = local_10a8 + 1;
        b32 = local_1020 + 0x20;
        puVar5 = local_1018 + 0x21;
      } while (local_10a8 != local_1098);
    }
    secp256k1_scalar_negate(&local_ee8,&local_ee8);
    iVar3 = secp256k1_scalar_add((secp256k1_scalar *)local_f08,&local_1070,&local_ee8);
    auVar9._0_4_ = -(uint)(local_f08._0_4_ == 0 && local_ef8._0_4_ == 0);
    auVar9._4_4_ = -(uint)(local_f08._4_4_ == 0 && local_ef8._4_4_ == 0);
    auVar9._8_4_ = -(uint)(local_f08._8_4_ == 0 && local_ef8._8_4_ == 0);
    auVar9._12_4_ = -(uint)(local_f08._12_4_ == 0 && local_ef8._12_4_ == 0);
    iVar3 = movmskps(iVar3,auVar9);
    iVar3 = (uint)(iVar3 != 0xf) * 2;
  }
  return iVar3;
}

Assistant:

int secp256k1_verify_mlsag(const secp256k1_context *ctx,
    const uint8_t *preimage, size_t nCols, size_t nRows,
    const uint8_t *pk, const uint8_t *ki, const uint8_t *pc, const uint8_t *ps)
{
    secp256k1_sha256 sha256_m, sha256_pre;
    secp256k1_scalar zero, clast, cSig, ss;
    secp256k1_ge ge1;
    secp256k1_gej gej1, gej2, L, R;
    size_t dsRows = nRows-1; /* TODO: pass in dsRows explicitly? */
    uint8_t tmp[33];
    size_t i, k, clen;
    int overflow;

    secp256k1_scalar_set_int(&zero, 0);

    secp256k1_scalar_set_b32(&clast, pc, &overflow);
    if (overflow || secp256k1_scalar_is_zero(&clast)) {
        return 1;
    }

    cSig = clast;

    secp256k1_sha256_initialize(&sha256_m);
    secp256k1_sha256_write(&sha256_m, preimage, 32);
    sha256_pre = sha256_m;

    for (i = 0; i < nCols; ++i) {
        sha256_m = sha256_pre; /* set to after preimage hashed */

        for (k = 0; k < dsRows; ++k) {
            /* L = G * ss + pk[k][i] * clast */
            secp256k1_scalar_set_b32(&ss, &ps[(i + k*nCols)*32], &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ss)) {
                return 1;
            }
            if (!secp256k1_eckey_pubkey_parse(&ge1, &pk[(i + k*nCols)*33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &L, &gej1, &clast, &ss);

            /* R = H(pk[k][i]) * ss + ki[k] * clast */
            if (0 != hash_to_curve(&ge1, &pk[(i + k*nCols)*33], 33)) { /* H(pk[k][i]) */
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &gej1, &gej1, &ss, &zero); /* gej1 = H(pk[k][i]) * ss */

            if (!secp256k1_eckey_pubkey_parse(&ge1, &ki[k * 33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej2, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej2, &clast, &zero); /* gej2 = ki[k] * clast */

            secp256k1_gej_add_var(&R, &gej1, &gej2, NULL);  /* R =  gej1 + gej2 */

            secp256k1_sha256_write(&sha256_m, &pk[(i + k*nCols)*33], 33); /* pk[k][i] */
            secp256k1_ge_set_gej(&ge1, &L);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* L */
            secp256k1_ge_set_gej(&ge1, &R);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* R */
        }

        for (k = dsRows; k < nRows; ++k) {
            /* L = G * ss + pk[k][i] * clast */
            secp256k1_scalar_set_b32(&ss, &ps[(i + k*nCols)*32], &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ss)) {
                return 1;
            }
            if (!secp256k1_eckey_pubkey_parse(&ge1, &pk[(i + k*nCols)*33], 33)) {
                return 1;
            }

            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &L, &gej1, &clast, &ss);

            secp256k1_sha256_write(&sha256_m, &pk[(i + k*nCols)*33], 33); /* pk[k][i] */
            secp256k1_ge_set_gej(&ge1, &L);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* L */
        };

        secp256k1_sha256_finalize(&sha256_m, tmp);
        secp256k1_scalar_set_b32(&clast, tmp, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&clast)) {
            return 1;
        }
    }

    secp256k1_scalar_negate(&cSig, &cSig);
    secp256k1_scalar_add(&zero, &clast, &cSig);

    return secp256k1_scalar_is_zero(&zero) ? 0 : 2; /* return 0 on success, 2 on failure */
}